

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_node.cpp
# Opt level: O1

void __thiscall si9ma::TreeNode::~TreeNode(TreeNode *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"destroy TreeNode(",0x11)
  ;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

TreeNode::~TreeNode() {
        cout << "destroy TreeNode(" << value << ")" << endl;
    }